

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void libtorrent::aux::anon_unknown_135::refresh_endpoint_list
               (session_interface *ses,bool is_ssl,bool complete_sent,announce_entry *ae)

{
  _Atomic_word *p_Var1;
  pointer paVar2;
  pointer paVar3;
  bool bVar4;
  uint32_t uVar5;
  int iVar6;
  const_iterator __cbeg;
  long lVar7;
  size_t valid_endpoints;
  bool local_5a;
  undefined1 local_59;
  listen_socket_handle local_58;
  long *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  local_5a = complete_sent;
  local_59 = is_ssl;
  bVar4 = is_i2p_url((string *)&ae->url);
  if (bVar4) {
    paVar2 = (ae->endpoints).
             super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar3 = (ae->endpoints).
             super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)paVar3 - (long)paVar2;
    if (1 < (ulong)((lVar7 >> 3) * -0x70a3d70a3d70a3d7)) {
      ::std::
      vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ::_M_erase(&ae->endpoints,paVar2 + 1,(announce_endpoint *)(lVar7 + (long)paVar2));
      return;
    }
    if (paVar2 == paVar3) {
      local_58.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_58.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::
      vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>
      ::emplace_back<libtorrent::aux::listen_socket_handle,bool_const&>
                ((vector<libtorrent::aux::announce_endpoint,std::allocator<libtorrent::aux::announce_endpoint>>
                  *)&ae->endpoints,&local_58,&local_5a);
      if (local_58.m_sock.
          super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &(local_58.m_sock.
                     super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_weak_count;
          iVar6 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar6 = (local_58.m_sock.
                   super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
          (local_58.m_sock.
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = iVar6 + -1;
        }
        if (iVar6 == 1) {
          (*(local_58.m_sock.
             super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
        }
      }
    }
  }
  else {
    uVar5 = (*(ses->super_session_logger)._vptr_session_logger[0x23])(ses);
    if (uVar5 != ae->listen_socket_version) {
      local_58.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_48 = (long *)0x0;
      uStack_40 = 0;
      local_38 = (code *)0x0;
      pcStack_30 = (code *)0x0;
      local_48 = (long *)operator_new(0x20);
      *local_48 = (long)&local_59;
      local_48[1] = (long)ae;
      local_48[2] = (long)&local_58;
      local_48[3] = (long)&local_5a;
      pcStack_30 = ::std::
                   _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2913:30)>
                   ::_M_invoke;
      local_38 = ::std::
                 _Function_handler<void_(const_libtorrent::aux::listen_socket_handle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:2913:30)>
                 ::_M_manager;
      (*(ses->super_session_logger)._vptr_session_logger[0x24])(ses,&local_48);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,3);
      }
      ::std::
      vector<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
      ::_M_erase(&ae->endpoints,
                 (ae->endpoints).
                 super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (int)local_58.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,
                 (ae->endpoints).
                 super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      ae->listen_socket_version = uVar5;
    }
  }
  return;
}

Assistant:

void refresh_endpoint_list(aux::session_interface& ses
		, bool const is_ssl, bool const complete_sent
		, aux::announce_entry& ae)
	{
#if TORRENT_USE_I2P
		if (is_i2p_url(ae.url))
		{
			if (ae.endpoints.size() > 1)
			{
				ae.endpoints.erase(ae.endpoints.begin() + 1, ae.endpoints.end());
			}
			else if (ae.endpoints.empty())
			{
				ae.endpoints.emplace_back(aux::listen_socket_handle(), complete_sent);
			}
			return;
		}
#endif

		auto const ver = ses.listen_socket_version();
		if (ver == ae.listen_socket_version)
			return;

		// update the endpoint list by adding entries for new listen sockets
		// and removing entries for non-existent ones
		std::size_t valid_endpoints = 0;
		ses.for_each_listen_socket([&](aux::listen_socket_handle const& s) {
			if (s.is_ssl() != is_ssl)
				return;
			for (auto& aep : ae.endpoints)
			{
				if (aep.socket != s) continue;
				std::swap(ae.endpoints[valid_endpoints], aep);
				valid_endpoints++;
				return;
			}

			ae.endpoints.emplace_back(s, complete_sent);
			std::swap(ae.endpoints[valid_endpoints], ae.endpoints.back());
			valid_endpoints++;
		});

#if TORRENT_USE_RTC
		if(auto pos = ae.url.find(':'); pos != string_view::npos)
		{
			string_view const protocol = string_view(ae.url).substr(0, pos);
			if (protocol == "ws" || protocol == "wss")
			{
				// WebSocket trackers will ignore the endpoint anyway
				valid_endpoints = std::min(valid_endpoints, std::size_t(1));
			}
		}
#endif

		TORRENT_ASSERT(valid_endpoints <= ae.endpoints.size());
		ae.endpoints.erase(ae.endpoints.begin() + int(valid_endpoints), ae.endpoints.end());
		ae.listen_socket_version = ver;
	}